

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::HostAddress::HostAddress(HostAddress *this,IPv6Address *ip6Address)

{
  IPv6Address *in_RSI;
  HostAddress *in_RDI;
  
  in_RDI->m_protocol = UnknownNetworkProtocol;
  in_RDI->m_ip4Address = 0;
  IPv6Address::IPv6Address((IPv6Address *)0x2fbc7e);
  std::__cxx11::string::string((string *)&in_RDI->m_ipString);
  in_RDI->m_hasIpAddress = true;
  SetAddress(in_RDI,in_RSI);
  return;
}

Assistant:

HostAddress::HostAddress(const IPv6Address& ip6Address)
    : m_protocol(HostAddress::UnknownNetworkProtocol)
    , m_ip4Address(0)
    , m_hasIpAddress(true)
{
    SetAddress(ip6Address);
}